

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O1

CordRepBtree * __thiscall
absl::lts_20250127::cord_internal::CordRepBtree::
AddData<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
          (CordRepBtree *this,CordRepBtree *tree,string_view data,size_t extra)

{
  int *piVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  size_t sVar6;
  long lVar7;
  OpResult OVar8;
  OpResult OVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  ulong uVar15;
  CordRepBtree *this_00;
  CordRep *pCVar17;
  StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1> *pSVar18;
  CordRepBtree *pCVar19;
  StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1> *pSVar20;
  StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1> *extra_00;
  long lVar21;
  Action AVar22;
  ulong uVar23;
  uint uVar24;
  StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1> *pSVar25;
  uint uVar26;
  StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1> *unaff_R13;
  StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1> *pSVar27;
  StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1> *unaff_R15;
  bool bVar28;
  string_view data_00;
  string_view sVar29;
  OpResult OVar30;
  OpResult OVar31;
  OpResult OVar32;
  OpResult OVar33;
  OpResult result;
  OpResult result_00;
  OpResult result_01;
  OpResult result_02;
  StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1> ops;
  char *local_b8;
  uint local_98 [2];
  long local_90 [12];
  StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1> *pSVar16;
  
  extra_00 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1> *)
             data._M_str;
  local_b8 = (char *)data._M_len;
  if (tree == (CordRepBtree *)0x0) {
    return this;
  }
  bVar2 = (this->super_CordRep).storage[0];
  pSVar27 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1> *)
            (ulong)bVar2;
  pSVar25 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1> *)0x0;
  pCVar19 = this;
  do {
    pSVar16 = pSVar27;
    if ((pSVar27 == pSVar25) ||
       (pSVar16 = pSVar25,
       (pCVar19->super_CordRep).refcount.count_.super___atomic_base<int>._M_i != 2)) {
      local_98[0] = (uint)((pCVar19->super_CordRep).refcount.count_.super___atomic_base<int>._M_i ==
                          2) + (int)pSVar16;
      pSVar25 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1> *)
                (ulong)local_98[0];
      uVar23 = (ulong)pSVar16 & 0xffffffff;
      uVar24 = (uint)bVar2;
      uVar15 = (ulong)pSVar16 & 0xffffffff;
      if ((int)pSVar16 <= (int)uVar24) {
        uVar15 = (ulong)uVar24;
      }
      goto LAB_004d02da;
    }
    local_90[(long)pSVar25] = (long)pCVar19;
    pSVar25 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1> *)
              ((long)&((CordRep *)&pSVar25->share_depth)->length + 1);
    pCVar19 = *(CordRepBtree **)
               ((pCVar19->super_CordRep).storage +
               (ulong)(pCVar19->super_CordRep).storage[2] * 8 + -5);
  } while ((pCVar19->super_CordRep).tag == '\x03');
  goto LAB_004d02f6;
  while( true ) {
    local_90[uVar23] = (long)pCVar19;
    uVar23 = uVar23 + 1;
    pCVar19 = *(CordRepBtree **)
               ((pCVar19->super_CordRep).storage +
               (ulong)(pCVar19->super_CordRep).storage[2] * 8 + -5);
    if ((pCVar19->super_CordRep).tag != '\x03') break;
LAB_004d02da:
    if (uVar15 == uVar23) {
      if ((ulong)(pCVar19->super_CordRep).storage[2] - (ulong)(pCVar19->super_CordRep).storage[1] <
          6) {
        if ((int)uVar24 < (int)local_98[0]) {
          unaff_R15 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                       *)0x0;
          this_00 = pCVar19;
        }
        else {
          sVar6 = (pCVar19->super_CordRep).length;
          this_00 = (CordRepBtree *)operator_new(0x40);
          (this_00->super_CordRep).refcount.count_.super___atomic_base<int>._M_i = 2;
          (this_00->super_CordRep).length = sVar6;
          *(undefined4 *)((long)this_00->edges_ + 0x2c) =
               *(undefined4 *)((long)pCVar19->edges_ + 0x2c);
          uVar10 = *(undefined8 *)&(pCVar19->super_CordRep).tag;
          uVar11 = *(undefined8 *)((long)pCVar19->edges_ + 4);
          uVar12 = *(undefined8 *)((long)pCVar19->edges_ + 0xc);
          uVar13 = *(undefined8 *)((long)pCVar19->edges_ + 0x14);
          uVar14 = *(undefined8 *)((long)pCVar19->edges_ + 0x24);
          *(undefined8 *)((long)this_00->edges_ + 0x1c) =
               *(undefined8 *)((long)pCVar19->edges_ + 0x1c);
          *(undefined8 *)((long)this_00->edges_ + 0x24) = uVar14;
          *(undefined8 *)((long)this_00->edges_ + 0xc) = uVar12;
          *(undefined8 *)((long)this_00->edges_ + 0x14) = uVar13;
          *(undefined8 *)&(this_00->super_CordRep).tag = uVar10;
          *(undefined8 *)((long)this_00->edges_ + 4) = uVar11;
          bVar3 = (pCVar19->super_CordRep).storage[1];
          bVar4 = (pCVar19->super_CordRep).storage[2];
          if (bVar3 != bVar4) {
            lVar21 = (ulong)bVar3 << 3;
            do {
              lVar7 = *(long *)((long)pCVar19->edges_ + lVar21);
              if (lVar7 == 0) {
                __assert_fail("rep != nullptr",
                              "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                              ,0x391,"static CordRep *absl::cord_internal::CordRep::Ref(CordRep *)")
                ;
              }
              LOCK();
              piVar1 = (int *)(lVar7 + 8);
              *piVar1 = *piVar1 + 2;
              UNLOCK();
              lVar21 = lVar21 + 8;
            } while ((ulong)bVar4 * 8 != lVar21);
          }
          unaff_R15 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                       *)0x1;
        }
        OVar31._8_8_ = unaff_R15;
        OVar31.tree = this_00;
        sVar29._M_str = local_b8;
        sVar29._M_len = (size_t)tree;
        pSVar25 = extra_00;
        sVar29 = AddData<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                           (this_00,sVar29,(size_t)extra_00);
        pSVar16 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1> *)
                  sVar29._M_len;
        if (pSVar16 ==
            (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1> *)0x0) {
          (this_00->super_CordRep).length =
               (size_t)((tree->super_CordRep).storage + ((this_00->super_CordRep).length - 0xd));
          pSVar20 = pSVar27;
          if (pSVar27 ==
              (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1> *)0x0)
          {
LAB_004d0558:
            result_00.tree = OVar31._8_8_;
            result_00._8_8_ = pSVar25;
            pSVar18 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                       *)cord_internal::anon_unknown_0::
                         StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                         ::Finalize((StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                                     *)this,OVar31.tree,result_00);
          }
          else {
            while( true ) {
              pCVar19 = OVar31.tree;
              uVar24 = (uint)pSVar20;
              uVar26 = uVar24 - 1;
              pSVar18 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                         *)local_90[(long)(int)uVar24 + -1];
              AVar22 = OVar31.action;
              pSVar25 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                         *)tree;
              if (AVar22 == kSelf) {
                *(uint8_t **)pSVar18 = (tree->super_CordRep).storage + *(long *)pSVar18 + -0xd;
                unaff_R15 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                             *)0x0;
                if (uVar24 < 2) {
                  pSVar20 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                             *)(ulong)uVar26;
                  OVar31._8_8_ = 0;
                  OVar31.tree = pCVar19;
                }
                else {
                  lVar21 = (ulong)uVar26 + 1;
                  do {
                    pSVar18 = *(StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                                **)(local_98 + lVar21 * 2 + -2);
                    *(uint8_t **)pSVar18 = (tree->super_CordRep).storage + *(long *)pSVar18 + -0xd;
                    lVar21 = lVar21 + -1;
                    uVar26 = uVar26 - 1;
                  } while (1 < lVar21);
                  unaff_R15 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                               *)0x0;
                  pSVar20 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                             *)(ulong)uVar26;
                  OVar31._8_8_ = 0;
                  OVar31.tree = pCVar19;
                }
              }
              else {
                unaff_R15 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                             *)0x1;
                pSVar25 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                           *)(ulong)local_98[0];
                if (AVar22 == kCopied) {
                  pSVar25 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                             *)tree;
                  OVar31 = SetEdge<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                                     ((CordRepBtree *)pSVar18,(int)uVar24 <= (int)local_98[0],
                                      &pCVar19->super_CordRep,(size_t)tree);
                }
                else if (AVar22 == kPopped) {
                  pSVar25 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                             *)tree;
                  OVar31 = AddEdge<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                                     ((CordRepBtree *)pSVar18,(int)uVar24 <= (int)local_98[0],
                                      &pCVar19->super_CordRep,(size_t)tree);
                }
                pSVar20 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                           *)(ulong)uVar26;
                pSVar18 = unaff_R13;
              }
              if ((char)unaff_R15 == '\0') break;
              unaff_R13 = pSVar18;
              if ((int)pSVar20 < 1) goto LAB_004d0558;
            }
          }
        }
        else {
          pSVar25 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1> *
                    )((long)tree - (long)pSVar16);
          if (pSVar25 ==
              (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1> *)0x0)
          {
            __assert_fail("delta > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                          ,0x279,
                          "static CordRepBtree *absl::cord_internal::CordRepBtree::AddData(CordRepBtree *, absl::string_view, size_t) [edge_type = absl::cord_internal::CordRepBtree::EdgeType::kBack]"
                         );
          }
          (this_00->super_CordRep).length =
               (long)&((CordRep *)((RefcountAndFlags *)pSVar25->stack + -2))->length +
               (this_00->super_CordRep).length;
          OVar30._8_8_ = unaff_R15;
          OVar30.tree = this_00;
          pSVar20 = pSVar27;
          if (pSVar27 ==
              (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1> *)0x0)
          {
LAB_004d0482:
            result.tree = OVar30._8_8_;
            result._8_8_ = pSVar25;
            pSVar18 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                       *)cord_internal::anon_unknown_0::
                         StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                         ::Finalize((StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                                     *)this,OVar30.tree,result);
          }
          else {
            while( true ) {
              OVar30 = OVar31;
              pCVar19 = OVar30.tree;
              uVar24 = (uint)pSVar20;
              unaff_R15 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                           *)(ulong)(uVar24 - 1);
              pSVar18 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                         *)local_90[(long)(int)uVar24 + -1];
              AVar22 = OVar30.action;
              if (AVar22 == kSelf) {
                *(long *)pSVar18 =
                     (long)&((CordRep *)((RefcountAndFlags *)pSVar25->stack + -2))->length +
                     *(long *)pSVar18;
                bVar28 = false;
                if (uVar24 < 2) {
                  OVar30._8_8_ = 0;
                  OVar30.tree = pCVar19;
                }
                else {
                  pCVar17 = (CordRep *)((long)&((CordRep *)&unaff_R15->share_depth)->length + 1);
                  do {
                    pSVar18 = *(StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                                **)(local_98 + (long)pCVar17 * 2 + -2);
                    *(long *)pSVar18 =
                         (long)&((CordRep *)((RefcountAndFlags *)pSVar25->stack + -2))->length +
                         *(long *)pSVar18;
                    pCVar17 = (CordRep *)((long)(pCVar17 + 0xffffffffffffffff) + 0xf);
                    unaff_R15 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                                 *)(ulong)((int)unaff_R15 - 1);
                  } while (1 < (long)pCVar17);
                  bVar28 = false;
                  OVar30._8_8_ = 0;
                  OVar30.tree = pCVar19;
                }
              }
              else {
                bVar28 = true;
                if (AVar22 == kCopied) {
                  OVar30 = SetEdge<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                                     ((CordRepBtree *)pSVar18,(int)uVar24 <= (int)local_98[0],
                                      &pCVar19->super_CordRep,(size_t)pSVar25);
                  local_90[(long)(int)uVar24 + -1] = (long)OVar30.tree;
                  pSVar18 = unaff_R13;
                }
                else {
                  pSVar18 = unaff_R13;
                  if (AVar22 == kPopped) {
                    __assert_fail("!propagate",
                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                                  ,0x145,
                                  "CordRepBtree *absl::cord_internal::(anonymous namespace)::StackOperations<absl::cord_internal::CordRepBtree::EdgeType::kBack>::Unwind(CordRepBtree *, int, size_t, OpResult) [edge_type = absl::cord_internal::CordRepBtree::EdgeType::kBack, propagate = true]"
                                 );
                  }
                }
              }
              if (!bVar28) break;
              pSVar20 = unaff_R15;
              unaff_R13 = pSVar18;
              OVar31 = OVar30;
              if ((int)unaff_R15 < 1) goto LAB_004d0482;
            }
          }
          this = (CordRepBtree *)pSVar18;
          local_98[0] = bVar2 + 1;
          pSVar18 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1> *
                    )this;
        }
        local_b8 = sVar29._M_str;
        tree = (CordRepBtree *)pSVar16;
        unaff_R13 = pSVar18;
        if (pSVar16 ==
            (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1> *)0x0) {
          return (CordRepBtree *)pSVar18;
        }
      }
      do {
        data_00._M_str = (char *)extra_00;
        data_00._M_len = (size_t)local_b8;
        pCVar19 = NewLeaf<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                            (tree,data_00,(size_t)pSVar25);
        pSVar16 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1> *)
                  (pCVar19->super_CordRep).length;
        if ((StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1> *)
            ((long)tree - (long)pSVar16) ==
            (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1> *)0x0) {
          OVar8._8_8_ = 2;
          OVar8.tree = pCVar19;
          OVar32._8_8_ = 2;
          OVar32.tree = pCVar19;
          pSVar20 = pSVar27;
          pSVar18 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1> *
                    )tree;
          if ((int)pSVar27 != 0) {
            do {
              pCVar19 = OVar32.tree;
              iVar5 = (int)pSVar20;
              pSVar25 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                         *)(ulong)(iVar5 - 1U);
              pSVar20 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                         *)local_90[(long)iVar5 + -1];
              AVar22 = OVar32.action;
              if (AVar22 == kSelf) {
                *(long *)pSVar20 =
                     (long)&((CordRep *)((RefcountAndFlags *)pSVar16->stack + -2))->length +
                     *(long *)pSVar20;
                bVar28 = false;
                if (iVar5 < 2) {
                  OVar32._8_8_ = 0;
                  OVar32.tree = pCVar19;
                  unaff_R13 = pSVar20;
                }
                else {
                  lVar21 = (ulong)(iVar5 - 1U) + 1;
                  do {
                    unaff_R13 = *(StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                                  **)(local_98 + lVar21 * 2 + -2);
                    *(long *)unaff_R13 =
                         (long)&((CordRep *)((RefcountAndFlags *)pSVar16->stack + -2))->length +
                         *(long *)unaff_R13;
                    lVar21 = lVar21 + -1;
                    pSVar25 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                               *)(ulong)((int)pSVar25 - 1);
                  } while (1 < lVar21);
                  bVar28 = false;
                  OVar32._8_8_ = 0;
                  OVar32.tree = pCVar19;
                }
              }
              else {
                bVar28 = true;
                if (AVar22 == kCopied) {
                  OVar32 = SetEdge<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                                     ((CordRepBtree *)pSVar20,iVar5 <= (int)local_98[0],
                                      &pCVar19->super_CordRep,(size_t)pSVar16);
                }
                else if (AVar22 == kPopped) {
                  OVar32 = AddEdge<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                                     ((CordRepBtree *)pSVar20,iVar5 <= (int)local_98[0],
                                      &pCVar19->super_CordRep,(size_t)pSVar16);
                }
              }
              unaff_R15 = pSVar25;
              if (!bVar28) goto LAB_004d0784;
              pSVar20 = pSVar25;
              OVar8 = OVar32;
            } while (0 < (int)pSVar25);
          }
          result_01.tree = OVar8._8_8_;
          result_01._8_8_ = pSVar25;
          unaff_R13 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                       *)cord_internal::anon_unknown_0::
                         StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                         ::Finalize((StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                                     *)this,OVar8.tree,result_01);
        }
        else {
          if (tree < pSVar16) {
            std::__throw_out_of_range_fmt
                      ("%s: __pos (which is %zu) > __size (which is %zu)",
                       "basic_string_view::substr",pSVar16,tree);
          }
          OVar9._8_8_ = 2;
          OVar9.tree = pCVar19;
          OVar33._8_8_ = 2;
          OVar33.tree = pCVar19;
          if ((int)pSVar27 != 0) {
            do {
              pCVar19 = OVar33.tree;
              iVar5 = (int)pSVar27;
              uVar24 = iVar5 - 1;
              pSVar25 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                         *)(long)iVar5;
              pSVar20 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                         *)local_90[(long)((long)pSVar25[-1].stack + 0x5f)];
              AVar22 = OVar33.action;
              if (AVar22 == kSelf) {
                *(long *)pSVar20 =
                     (long)&((CordRep *)((RefcountAndFlags *)pSVar16->stack + -2))->length +
                     *(long *)pSVar20;
                bVar28 = false;
                if (iVar5 < 2) {
                  pSVar27 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                             *)(ulong)uVar24;
                  OVar33._8_8_ = 0;
                  OVar33.tree = pCVar19;
                }
                else {
                  pSVar25 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                             *)((ulong)uVar24 + 1);
                  do {
                    pSVar20 = *(StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                                **)(local_98 + (long)pSVar25 * 2 + -2);
                    *(long *)pSVar20 =
                         (long)&((CordRep *)((RefcountAndFlags *)pSVar16->stack + -2))->length +
                         *(long *)pSVar20;
                    pSVar25 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                               *)((long)pSVar25[-1].stack + 0x5f);
                    uVar24 = uVar24 - 1;
                  } while (1 < (long)pSVar25);
                  bVar28 = false;
                  pSVar27 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                             *)(ulong)uVar24;
                  OVar33._8_8_ = 0;
                  OVar33.tree = pCVar19;
                }
              }
              else {
                bVar28 = true;
                pSVar25 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                           *)(ulong)local_98[0];
                if (AVar22 == kCopied) {
                  pSVar25 = pSVar16;
                  OVar33 = SetEdge<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                                     ((CordRepBtree *)pSVar20,iVar5 <= (int)local_98[0],
                                      &pCVar19->super_CordRep,(size_t)pSVar16);
                }
                else if (AVar22 == kPopped) {
                  pSVar25 = pSVar16;
                  OVar33 = AddEdge<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                                     ((CordRepBtree *)pSVar20,iVar5 <= (int)local_98[0],
                                      &pCVar19->super_CordRep,(size_t)pSVar16);
                }
                pSVar27 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                           *)(ulong)uVar24;
                pSVar20 = unaff_R15;
              }
              unaff_R15 = pSVar20;
              if (!bVar28) goto LAB_004d071c;
              OVar9 = OVar33;
            } while (0 < (int)pSVar27);
          }
          result_02.tree = OVar9._8_8_;
          result_02._8_8_ = pSVar25;
          pSVar20 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1> *
                    )cord_internal::anon_unknown_0::
                     StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>::
                     Finalize((StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                               *)this,OVar9.tree,result_02);
LAB_004d071c:
          bVar2 = *(uint8_t *)((long)((RefcountAndFlags *)pSVar20->stack + 1) + 1);
          pSVar27 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1> *
                    )(ulong)bVar2;
          if (0xb < bVar2) {
            __assert_fail("height <= CordRepBtree::kMaxHeight",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                          ,0x103,
                          "void absl::cord_internal::(anonymous namespace)::StackOperations<absl::cord_internal::CordRepBtree::EdgeType::kBack>::BuildOwnedStack(CordRepBtree *, int) [edge_type = absl::cord_internal::CordRepBtree::EdgeType::kBack]"
                         );
          }
          local_b8 = local_b8 + (long)pSVar16;
          pSVar25 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1> *
                    )-(ulong)(uint)bVar2;
          lVar21 = 1;
          pSVar18 = pSVar20;
          while (iVar5 = (((RefcountAndFlags *)pSVar18->stack)->count_).super___atomic_base<int>.
                         _M_i,
                (long)&((CordRep *)((RefcountAndFlags *)pSVar25->stack + -2))->length + lVar21 != 1)
          {
            if (iVar5 != 2) {
              __assert_fail("tree->refcount.IsOne()",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                            ,0x106,
                            "void absl::cord_internal::(anonymous namespace)::StackOperations<absl::cord_internal::CordRepBtree::EdgeType::kBack>::BuildOwnedStack(CordRepBtree *, int) [edge_type = absl::cord_internal::CordRepBtree::EdgeType::kBack]"
                           );
            }
            local_90[lVar21 + -1] = (long)pSVar18;
            pSVar18 = *(StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1>
                        **)((RefcountAndFlags *)pSVar18->stack +
                           (ulong)*(uint8_t *)((long)((RefcountAndFlags *)pSVar18->stack + 1) + 3) *
                           2);
            lVar21 = lVar21 + 1;
            if (*(uint8_t *)((RefcountAndFlags *)pSVar18->stack + 1) != '\x03') goto LAB_004d02f6;
          }
          if (iVar5 != 2) {
            __assert_fail("tree->refcount.IsOne()",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                          ,0x10a,
                          "void absl::cord_internal::(anonymous namespace)::StackOperations<absl::cord_internal::CordRepBtree::EdgeType::kBack>::BuildOwnedStack(CordRepBtree *, int) [edge_type = absl::cord_internal::CordRepBtree::EdgeType::kBack]"
                         );
          }
          local_98[0] = (uint)lVar21;
          pSVar18 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1> *
                    )((long)tree - (long)pSVar16);
          this = (CordRepBtree *)pSVar20;
        }
LAB_004d0784:
        bVar28 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)1> *)
                 tree == pSVar16;
        tree = (CordRepBtree *)pSVar18;
        if (bVar28) {
          return (CordRepBtree *)unaff_R13;
        }
      } while( true );
    }
  }
LAB_004d02f6:
  __assert_fail("IsBtree()",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                ,599,"CordRepBtree *absl::cord_internal::CordRep::btree()");
}

Assistant:

CordRepBtree* CordRepBtree::AddData(CordRepBtree* tree, absl::string_view data,
                                    size_t extra) {
  if (ABSL_PREDICT_FALSE(data.empty())) return tree;

  const size_t original_data_size = data.size();
  int depth = tree->height();
  StackOperations<edge_type> ops;
  CordRepBtree* leaf = ops.BuildStack(tree, depth);

  // If there is capacity in the last edge, append as much data
  // as possible into this last edge.
  if (leaf->size() < leaf->capacity()) {
    OpResult result = leaf->ToOpResult(ops.owned(depth));
    data = result.tree->AddData<edge_type>(data, extra);
    if (data.empty()) {
      result.tree->length += original_data_size;
      return ops.Unwind(tree, depth, original_data_size, result);
    }

    // We added some data into this leaf, but not all. Propagate the added
    // length to the top most node, and rebuild the stack with any newly copied
    // or updated nodes. From this point on, the path (leg) from the top most
    // node to the right-most node towards the leaf node is privately owned.
    size_t delta = original_data_size - data.size();
    assert(delta > 0);
    result.tree->length += delta;
    tree = ops.Propagate(tree, depth, delta, result);
    ops.share_depth = depth + 1;
  }

  // We were unable to append all data into the existing right-most leaf node.
  // This means all remaining data must be put into (a) new leaf node(s) which
  // we append to the tree. To make this efficient, we iteratively build full
  // leaf nodes from `data` until the created leaf contains all remaining data.
  // We utilize the `Unwind` method to merge the created leaf into the first
  // level towards root that has capacity. On each iteration with remaining
  // data, we rebuild the stack in the knowledge that right-most nodes are
  // privately owned after the first `Unwind` completes.
  for (;;) {
    OpResult result = {CordRepBtree::NewLeaf<edge_type>(data, extra), kPopped};
    if (result.tree->length == data.size()) {
      return ops.Unwind(tree, depth, result.tree->length, result);
    }
    data = Consume<edge_type>(data, result.tree->length);
    tree = ops.Unwind(tree, depth, result.tree->length, result);
    depth = tree->height();
    ops.BuildOwnedStack(tree, depth);
  }
}